

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O2

void __thiscall Activation::Set(Activation *this,size_t up_index,size_t right_index,Sexp *value)

{
  uint __line;
  pointer ppSVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  char *__assertion;
  size_t diff;
  bool bVar4;
  Sexp *local_50;
  size_t local_48;
  Sexp *local_40;
  ContractFrameProtector local_38;
  ContractFrameProtector __contract_frame;
  
  ContractFrameProtector::ContractFrameProtector(&local_38,"Set");
  ContractFrame::AddContract(local_38.protected_frame,NoGc);
  if (value->kind == ACTIVATION) {
    __assertion = "!value->IsActivation()";
    __line = 0x42;
  }
  else {
    while (bVar4 = up_index != 0, up_index = up_index - 1, bVar4) {
      if (this == (Activation *)0x0) {
        __assertion = "cursor != nullptr";
        __line = 0x46;
        goto LAB_00117117;
      }
      if (this->parent->kind != ACTIVATION) {
        __assertion = "cursor->parent->IsActivation()";
        __line = 0x47;
        goto LAB_00117117;
      }
      this = (this->parent->field_1).activation;
    }
    if (this == (Activation *)0x0) {
      __assertion = "cursor != nullptr";
      __line = 0x4b;
    }
    else {
      ppSVar1 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar2 = (long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3;
      local_48 = right_index;
      if (uVar2 <= right_index) {
        local_40 = value;
        for (uVar3 = 0; uVar3 <= right_index - uVar2; uVar3 = uVar3 + 1) {
          local_50 = (Sexp *)0x0;
          std::vector<Sexp*,std::allocator<Sexp*>>::emplace_back<Sexp*>
                    ((vector<Sexp*,std::allocator<Sexp*>> *)&this->slots,&local_50);
        }
        ppSVar1 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar2 = (long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3;
        value = local_40;
      }
      if (local_48 < uVar2) {
        ppSVar1[local_48] = value;
        ContractFrameProtector::~ContractFrameProtector(&local_38);
        return;
      }
      __assertion = "right_index < cursor->slots.size()";
      __line = 0x55;
    }
  }
LAB_00117117:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                ,__line,"void Activation::Set(size_t, size_t, Sexp *)");
}

Assistant:

void Activation::Set(size_t up_index, size_t right_index, Sexp *value) {
  CONTRACT { FORBID_GC; }